

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# any_executor.hpp
# Opt level: O0

void __thiscall
asio::execution::detail::any_executor_base::any_executor_base
          (any_executor_base *this,any_executor_base *other)

{
  long in_RSI;
  long in_RDI;
  
  if (*(long *)(in_RSI + 0x20) == 0) {
    *(undefined8 *)(in_RDI + 0x18) = 0;
    *(undefined8 *)(in_RDI + 0x20) = 0;
    *(undefined8 *)(in_RDI + 0x28) = 0;
  }
  else {
    *(undefined8 *)(in_RDI + 0x18) = *(undefined8 *)(in_RSI + 0x18);
    *(undefined8 *)(in_RDI + 0x28) = *(undefined8 *)(in_RSI + 0x28);
    *(undefined8 *)(in_RSI + 0x18) = 0;
    *(undefined8 *)(in_RSI + 0x28) = 0;
    (**(code **)(*(long *)(in_RDI + 0x18) + 0x10))(in_RDI,in_RSI);
    *(undefined8 *)(in_RSI + 0x20) = 0;
  }
  return;
}

Assistant:

any_executor_base(any_executor_base&& other) noexcept
  {
    if (other.target_)
    {
      object_fns_ = other.object_fns_;
      target_fns_ = other.target_fns_;
      other.object_fns_ = 0;
      other.target_fns_ = 0;
      object_fns_->move(*this, other);
      other.target_ = 0;
    }
    else
    {
      object_fns_ = 0;
      target_ = 0;
      target_fns_ = 0;
    }
  }